

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

char * bssl::anon_unknown_0::LevelToString(ssl_encryption_level_t level)

{
  char *pcStack_10;
  ssl_encryption_level_t level_local;
  
  switch(level) {
  case ssl_encryption_initial:
    pcStack_10 = "initial";
    break;
  case ssl_encryption_early_data:
    pcStack_10 = "early data";
    break;
  case ssl_encryption_handshake:
    pcStack_10 = "handshake";
    break;
  case ssl_encryption_application:
    pcStack_10 = "application";
    break;
  default:
    pcStack_10 = "<unknown>";
  }
  return pcStack_10;
}

Assistant:

const char *LevelToString(ssl_encryption_level_t level) {
  switch (level) {
    case ssl_encryption_initial:
      return "initial";
    case ssl_encryption_early_data:
      return "early data";
    case ssl_encryption_handshake:
      return "handshake";
    case ssl_encryption_application:
      return "application";
  }
  return "<unknown>";
}